

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConfigUseClauseSyntax *pCVar1;
  DeepCloneVisitor visitor;
  ConfigCellIdentifierSyntax *local_60;
  Token local_58;
  Token local_48;
  ParameterValueAssignmentSyntax *local_38;
  Token local_30;
  
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x28) == (SyntaxNode *)0x0) {
    local_60 = (ConfigCellIdentifierSyntax *)0x0;
  }
  else {
    local_60 = (ConfigCellIdentifierSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_38 = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    local_38 = (ParameterValueAssignmentSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x48),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConfigUseClauseSyntax,slang::parsing::Token,slang::syntax::ConfigCellIdentifierSyntax*,slang::syntax::ParameterValueAssignmentSyntax*,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_48,&local_60,&local_38,&local_58,
                      &local_30);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConfigUseClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConfigUseClauseSyntax>(
        node.use.deepClone(alloc),
        node.name ? deepClone(*node.name, alloc) : nullptr,
        node.paramAssignments ? deepClone(*node.paramAssignments, alloc) : nullptr,
        node.colon.deepClone(alloc),
        node.config.deepClone(alloc)
    );
}